

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatHeap.h
# Opt level: O0

void xSAT_HeapPercolateDown(xSAT_Heap_t *h,int i)

{
  Vec_Int_t *pVVar1;
  int y;
  int iVar2;
  int iVar3;
  int local_44;
  int child;
  int x;
  int i_local;
  xSAT_Heap_t *h_local;
  
  y = Vec_IntEntry(h->vHeap,i);
  child = i;
  while( true ) {
    iVar2 = Left(child);
    iVar3 = Vec_IntSize(h->vHeap);
    if (iVar3 <= iVar2) break;
    iVar2 = Right(child);
    iVar3 = Vec_IntSize(h->vHeap);
    if (iVar2 < iVar3) {
      pVVar1 = h->vHeap;
      iVar2 = Right(child);
      iVar2 = Vec_IntEntry(pVVar1,iVar2);
      pVVar1 = h->vHeap;
      iVar3 = Left(child);
      iVar3 = Vec_IntEntry(pVVar1,iVar3);
      iVar2 = Compare(h,iVar2,iVar3);
      if (iVar2 == 0) goto LAB_00bc04d1;
      local_44 = Right(child);
    }
    else {
LAB_00bc04d1:
      local_44 = Left(child);
    }
    iVar2 = Vec_IntEntry(h->vHeap,local_44);
    iVar2 = Compare(h,iVar2,y);
    if (iVar2 == 0) break;
    pVVar1 = h->vHeap;
    iVar2 = Vec_IntEntry(h->vHeap,local_44);
    Vec_IntWriteEntry(pVVar1,child,iVar2);
    pVVar1 = h->vIndices;
    iVar2 = Vec_IntEntry(h->vHeap,child);
    Vec_IntWriteEntry(pVVar1,iVar2,child);
    child = local_44;
  }
  Vec_IntWriteEntry(h->vHeap,child,y);
  Vec_IntWriteEntry(h->vIndices,y,child);
  return;
}

Assistant:

static inline void xSAT_HeapPercolateDown( xSAT_Heap_t * h, int i )
{
    int x = Vec_IntEntry( h->vHeap, i );

    while ( Left( i ) < Vec_IntSize( h->vHeap ) )
    {
        int child = Right( i ) < Vec_IntSize( h->vHeap ) &&
                    Compare( h, Vec_IntEntry( h->vHeap, Right( i ) ), Vec_IntEntry( h->vHeap, Left( i ) ) ) ?
                    Right( i ) : Left( i );

        if ( !Compare( h, Vec_IntEntry( h->vHeap, child ), x ) )
            break;

        Vec_IntWriteEntry( h->vHeap, i, Vec_IntEntry( h->vHeap, child ) );
        Vec_IntWriteEntry( h->vIndices, Vec_IntEntry( h->vHeap, i ), i );
        i = child;
    }
    Vec_IntWriteEntry( h->vHeap, i, x );
    Vec_IntWriteEntry( h->vIndices, x, i );
}